

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

int arena_i_initialized_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  _Bool _Var1;
  int iVar2;
  undefined8 in_RAX;
  ctl_arena_t *pcVar3;
  size_t copylen;
  ulong uVar4;
  undefined7 uStack_28;
  _Bool initialized;
  
  if (newp == (void *)0x0 && newlen == 0) {
    uVar4 = mib[1];
    if (uVar4 >> 0x20 == 0) {
      _uStack_28 = in_RAX;
      malloc_mutex_lock((tsdn_t *)tsd,&ctl_mtx);
      pcVar3 = arenas_i(uVar4);
      _Var1 = pcVar3->initialized;
      _uStack_28 = CONCAT17(_Var1,uStack_28);
      ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
      iVar2 = 0;
      if (oldlenp != (size_t *)0x0 && oldp != (void *)0x0) {
        if (*oldlenp == 1) {
          *(_Bool *)oldp = _Var1;
        }
        else {
          uVar4 = (ulong)(*oldlenp != 0);
          switchD_00916250::default(oldp,&initialized,uVar4);
          *oldlenp = uVar4;
          iVar2 = 0x16;
        }
      }
    }
    else {
      iVar2 = 0xe;
    }
  }
  else {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int
arena_i_initialized_ctl(tsd_t *tsd, const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	tsdn_t *tsdn = tsd_tsdn(tsd);
	unsigned arena_ind;
	bool initialized;

	READONLY();
	MIB_UNSIGNED(arena_ind, 1);

	malloc_mutex_lock(tsdn, &ctl_mtx);
	initialized = arenas_i(arena_ind)->initialized;
	malloc_mutex_unlock(tsdn, &ctl_mtx);

	READ(initialized, bool);

	ret = 0;
label_return:
	return ret;
}